

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiMesh **_dest,aiMesh *src)

{
  long lVar1;
  uint uVar2;
  aiVector3D *paVar3;
  aiColor4D *__src;
  aiBone **ppaVar4;
  aiFace *paVar5;
  void *__src_00;
  aiAnimMesh **ppaVar6;
  aiMesh *__dest;
  aiVector3D *paVar7;
  aiColor4D *__dest_00;
  aiBone **ppaVar8;
  ulong *puVar9;
  aiFace *__dest_01;
  void *__dest_02;
  aiAnimMesh **ppaVar10;
  aiFace *paVar11;
  ulong uVar12;
  aiVector3t<float> *old;
  long lVar13;
  ulong uVar14;
  aiColor4t<float> *old_1;
  
  if (src != (aiMesh *)0x0 && _dest != (aiMesh **)0x0) {
    __dest = (aiMesh *)operator_new(0x520);
    *_dest = __dest;
    memcpy(__dest,src,0x520);
    uVar2 = __dest->mNumVertices;
    uVar12 = (ulong)uVar2;
    paVar3 = __dest->mVertices;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar14 = uVar12 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar14);
      if (uVar12 != 0) {
        memset(paVar7,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mVertices = paVar7;
      memcpy(paVar7,paVar3,uVar14);
    }
    paVar3 = __dest->mNormals;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar14 = uVar12 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar14);
      if (uVar12 != 0) {
        memset(paVar7,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mNormals = paVar7;
      memcpy(paVar7,paVar3,uVar14);
    }
    paVar3 = __dest->mTangents;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar14 = uVar12 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar14);
      if (uVar12 != 0) {
        memset(paVar7,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mTangents = paVar7;
      memcpy(paVar7,paVar3,uVar14);
    }
    paVar3 = __dest->mBitangents;
    if (paVar3 != (aiVector3D *)0x0) {
      uVar14 = uVar12 * 0xc;
      paVar7 = (aiVector3D *)operator_new__(uVar14);
      if (uVar12 != 0) {
        memset(paVar7,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
      }
      __dest->mBitangents = paVar7;
      memcpy(paVar7,paVar3,uVar14);
    }
    lVar13 = 0;
    do {
      paVar3 = __dest->mTextureCoords[lVar13];
      if ((paVar3 == (aiVector3D *)0x0) || (uVar2 == 0)) break;
      lVar1 = lVar13 + 1;
      paVar7 = (aiVector3D *)operator_new__(uVar12 * 0xc);
      memset(paVar7,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      __dest->mTextureCoords[lVar13] = paVar7;
      memcpy(paVar7,paVar3,uVar12 * 0xc);
      lVar13 = lVar1;
    } while (lVar1 != 8);
    lVar13 = 0;
    do {
      __src = __dest->mColors[lVar13];
      if ((__src == (aiColor4D *)0x0) || (uVar2 == 0)) break;
      lVar1 = lVar13 + 1;
      __dest_00 = (aiColor4D *)operator_new__(uVar12 << 4);
      __dest->mColors[lVar13] = __dest_00;
      memcpy(__dest_00,__src,uVar12 << 4);
      lVar13 = lVar1;
    } while (lVar1 != 8);
    if ((ulong)__dest->mNumBones == 0) {
      __dest->mBones = (aiBone **)0x0;
    }
    else {
      ppaVar4 = __dest->mBones;
      uVar14 = (ulong)__dest->mNumBones << 3;
      ppaVar8 = (aiBone **)operator_new__(uVar14);
      __dest->mBones = ppaVar8;
      uVar12 = 0;
      do {
        Copy((aiBone **)((long)__dest->mBones + uVar12),*(aiBone **)((long)ppaVar4 + uVar12));
        uVar12 = uVar12 + 8;
      } while (uVar14 != uVar12);
    }
    paVar5 = __dest->mFaces;
    uVar2 = __dest->mNumFaces;
    uVar12 = (ulong)uVar2;
    if (paVar5 != (aiFace *)0x0) {
      puVar9 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
      *puVar9 = uVar12;
      __dest_01 = (aiFace *)(puVar9 + 1);
      if (uVar2 != 0) {
        paVar11 = __dest_01;
        do {
          paVar11->mNumIndices = 0;
          paVar11->mIndices = (uint *)0x0;
          paVar11 = paVar11 + 1;
        } while (paVar11 != __dest_01 + uVar12);
      }
      __dest->mFaces = __dest_01;
      memcpy(__dest_01,paVar5,uVar12 * 0x10);
    }
    if (uVar2 != 0) {
      lVar13 = 8;
      uVar14 = 0;
      do {
        paVar5 = __dest->mFaces;
        __src_00 = *(void **)((long)&paVar5->mNumIndices + lVar13);
        if (__src_00 != (void *)0x0) {
          uVar12 = (ulong)*(uint *)((long)paVar5 + lVar13 + -8) << 2;
          __dest_02 = operator_new__(uVar12);
          *(void **)((long)&paVar5->mNumIndices + lVar13) = __dest_02;
          memcpy(__dest_02,__src_00,uVar12);
          uVar12 = (ulong)__dest->mNumFaces;
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar14 < uVar12);
    }
    if ((ulong)__dest->mNumAnimMeshes == 0) {
      __dest->mAnimMeshes = (aiAnimMesh **)0x0;
    }
    else {
      ppaVar6 = __dest->mAnimMeshes;
      uVar14 = (ulong)__dest->mNumAnimMeshes << 3;
      ppaVar10 = (aiAnimMesh **)operator_new__(uVar14);
      __dest->mAnimMeshes = ppaVar10;
      uVar12 = 0;
      do {
        Copy((aiAnimMesh **)((long)__dest->mAnimMeshes + uVar12),
             *(aiAnimMesh **)((long)ppaVar6 + uVar12));
        uVar12 = uVar12 + 8;
      } while (uVar14 != uVar12);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy( aiMesh** _dest, const aiMesh* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMesh* dest = *_dest = new aiMesh();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMesh));

    // and reallocate all arrays
    GetArrayCopy( dest->mVertices,   dest->mNumVertices );
    GetArrayCopy( dest->mNormals ,   dest->mNumVertices );
    GetArrayCopy( dest->mTangents,   dest->mNumVertices );
    GetArrayCopy( dest->mBitangents, dest->mNumVertices );

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy( dest->mTextureCoords[n++],   dest->mNumVertices );

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy( dest->mColors[n++],   dest->mNumVertices );

    // make a deep copy of all bones
    CopyPtrArray(dest->mBones,dest->mBones,dest->mNumBones);

    // make a deep copy of all faces
    GetArrayCopy(dest->mFaces,dest->mNumFaces);
    for (unsigned int i = 0; i < dest->mNumFaces;++i) {
        aiFace& f = dest->mFaces[i];
        GetArrayCopy(f.mIndices,f.mNumIndices);
    }

    // make a deep copy of all blend shapes
    CopyPtrArray(dest->mAnimMeshes, dest->mAnimMeshes, dest->mNumAnimMeshes);
}